

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateConstexprDefines_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  pointer pFVar3;
  pointer pEVar4;
  _Base_ptr p_Var5;
  long *plVar6;
  pointer pRVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Rb_tree_node_base *p_Var9;
  size_type sVar10;
  bool bVar11;
  int iVar12;
  _Base_ptr p_Var13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar15;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  string *extraout_RDX_01;
  string *macro;
  string *macro_00;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 uVar16;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  FeatureData *feature;
  pointer listedConstants_00;
  _Base_ptr __rhs;
  _Alloc_hider _Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  undefined1 *puVar19;
  pointer pEVar20;
  long *plVar21;
  long lVar22;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_04;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_05;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_06;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_07;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_08;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_09;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_10;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_11;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  string *constexprDefines;
  string extensionConstexprDefinesTemplate;
  string valueString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> thisExtensionConstexprs;
  string extensionConstexprs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listedConstants;
  string deprecatedPrefix;
  string deprecationMessage;
  string deprecated;
  anon_class_16_2_bca86f44 generateConstantsAndProtection;
  string deprecatedAttribute;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> extensionVar;
  string constexprValueTemplate;
  string constexprCallTemplate;
  string constexprFunctionTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> specVersionVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_698;
  VulkanHppGenerator *local_690;
  allocator_type local_686;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_685;
  allocator_type local_684;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_683;
  allocator_type local_682;
  allocator_type local_681;
  string local_680;
  string local_660;
  undefined1 local_640 [64];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_600;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_580;
  string local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_500;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_440;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  string local_3c0;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string local_340;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  local_690 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_300,
             "  template <typename T, typename = typename std::enable_if<std::is_integral<T>::value>::type>\n  ${deprecated}VULKAN_HPP_CONSTEXPR uint32_t ${constName}( ${arguments} )\n  {\n    return ${implementation};\n  }\n"
             ,"");
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,
             "  ${deprecated}VULKAN_HPP_CONSTEXPR_INLINE auto ${constName} = ${callee}( ${arguments} );\n"
             ,"");
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_340,
             "  ${deprecated}VULKAN_HPP_CONSTEXPR_INLINE ${type} ${constName} = ${value};\n","");
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c0,"VULKAN_HPP_DEPRECATED(\"${reason}\") ","");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "\n  //===========================\n  //=== CONSTEXPR CONSTANTs ===\n  //===========================\n"
             ,"");
  local_440.first._M_string_length = (size_type)local_690;
  local_640._24_8_ = local_640 + 8;
  local_640._8_8_ = (ulong)(uint)local_640._12_4_ << 0x20;
  local_640._16_8_ = (_Base_ptr)0x0;
  local_640._40_8_ = 0;
  listedConstants_00 =
       (local_690->m_features).
       super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pFVar3 = (local_690->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_640._32_8_ = local_640._24_8_;
  local_440.first._M_dataplus._M_p = (pointer)&local_340;
  if (listedConstants_00 != pFVar3) {
    do {
      generateConstexprDefines::anon_class_16_2_bca86f44::operator()
                (&local_500.first,(anon_class_16_2_bca86f44 *)&local_440,
                 (vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                  *)(listedConstants_00->requireData).
                    super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                 &((listedConstants_00->requireData).
                   super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->api,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)listedConstants_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_500.first._M_dataplus._M_p,
                 local_500.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500.first._M_dataplus._M_p != &local_500.first.field_2) {
        operator_delete(local_500.first._M_dataplus._M_p,
                        CONCAT71(local_500.first.field_2._M_allocated_capacity._1_7_,
                                 local_500.first.field_2._M_local_buf[0]) + 1);
      }
      listedConstants_00 = listedConstants_00 + 1;
    } while (listedConstants_00 != pFVar3);
  }
  pEVar20 = (local_690->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (local_690->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar20 != pEVar4) {
    do {
      generateConstexprDefines::anon_class_16_2_bca86f44::operator()
                (&local_500.first,(anon_class_16_2_bca86f44 *)&local_440,
                 (vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                  *)(pEVar20->requireData).
                    super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                 &((pEVar20->requireData).
                   super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->api,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&pEVar20->name);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_500.first._M_dataplus._M_p,
                 local_500.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500.first._M_dataplus._M_p != &local_500.first.field_2) {
        operator_delete(local_500.first._M_dataplus._M_p,
                        CONCAT71(local_500.first.field_2._M_allocated_capacity._1_7_,
                                 local_500.first.field_2._M_local_buf[0]) + 1);
      }
      pEVar20 = pEVar20 + 1;
    } while (pEVar20 != pEVar4);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_640);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,
             "\n  //========================\n  //=== CONSTEXPR VALUEs ===\n  //========================\n"
            );
  p_Var13 = (local_690->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  local_698 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&(local_690->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header;
  if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)p_Var13 != local_698) {
    do {
      if ((char)p_Var13[2]._M_color == _S_black) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_640,(char (*) [7])"reason",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &p_Var13[3]._M_left);
        __l._M_len = 1;
        __l._M_array = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_640;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_60,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_440,(allocator_type *)&local_6d8);
        replaceWithMap(&local_500.first,&local_3c0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_60);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_60);
        if ((_Base_ptr)local_640._32_8_ != (_Base_ptr)(local_640 + 0x30)) {
          operator_delete((void *)local_640._32_8_,local_640._48_8_ + 1);
        }
        if ((_Base_ptr)local_640._0_8_ != (_Base_ptr)(local_640 + 0x10)) {
          operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
        }
      }
      else {
        local_500.first._M_dataplus._M_p = (pointer)&local_500.first.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"");
      }
      toCamelCase((string *)local_640,(string *)(p_Var13 + 1),false);
      local_6d8.first._M_dataplus._M_p = (pointer)&local_6d8.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"Vk","");
      local_440.first._M_dataplus._M_p = (pointer)&local_440.first.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_440,local_640._0_8_,(char *)(local_640._8_8_ + local_640._0_8_));
      sVar10 = local_6d8.first._M_string_length;
      _Var17._M_p = local_6d8.first._M_dataplus._M_p;
      if ((local_6d8.first._M_string_length <= local_440.first._M_string_length) &&
         (((VulkanHppGenerator *)local_6d8.first._M_string_length == (VulkanHppGenerator *)0x0 ||
          (iVar12 = bcmp(local_440.first._M_dataplus._M_p,local_6d8.first._M_dataplus._M_p,
                         local_6d8.first._M_string_length), iVar12 == 0)))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&local_440.first,0,sVar10);
        _Var17._M_p = local_6d8.first._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var17._M_p != &local_6d8.first.field_2) {
        operator_delete(_Var17._M_p,
                        CONCAT71(local_6d8.first.field_2._M_allocated_capacity._1_7_,
                                 local_6d8.first.field_2._M_local_buf[0]) + 1);
      }
      if ((_Base_ptr)local_640._0_8_ != (_Base_ptr)(local_640 + 0x10)) {
        operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[5],_const_char_(&)[9],_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_640,(char (*) [5])0x22242f,(char (*) [9])"uint32_t");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[10],_true>(&local_600,(char (*) [10])"constName",&local_440.first);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_true>(&local_5c0,(char (*) [11])"deprecated",&local_500.first);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[6],_true>
                (&local_580,(char (*) [6])0x22fc00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var13 + 1))
      ;
      __l_00._M_len = 4;
      __l_00._M_array =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_640;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_90,__l_00,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_6f8,(allocator_type *)&local_660);
      replaceWithMap(&local_6d8.first,&local_340,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_90);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_90);
      lVar22 = -0x100;
      paVar18 = &local_580.second.field_2;
      do {
        if (paVar18 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar18->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                          paVar18->_M_allocated_capacity + 1);
        }
        if (&paVar18->_M_allocated_capacity + -4 !=
            (size_type *)(&paVar18->_M_allocated_capacity)[-6]) {
          operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                          (&paVar18->_M_allocated_capacity)[-4] + 1);
        }
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar18->_M_allocated_capacity + -8);
        lVar22 = lVar22 + 0x40;
      } while (lVar22 != 0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_6d8.first._M_dataplus._M_p,
                 local_6d8.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8.first._M_dataplus._M_p != &local_6d8.first.field_2) {
        operator_delete(local_6d8.first._M_dataplus._M_p,
                        CONCAT71(local_6d8.first.field_2._M_allocated_capacity._1_7_,
                                 local_6d8.first.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440.first._M_dataplus._M_p != &local_440.first.field_2) {
        operator_delete(local_440.first._M_dataplus._M_p,
                        local_440.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500.first._M_dataplus._M_p != &local_500.first.field_2) {
        operator_delete(local_500.first._M_dataplus._M_p,
                        CONCAT71(local_500.first.field_2._M_allocated_capacity._1_7_,
                                 local_500.first.field_2._M_local_buf[0]) + 1);
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)p_Var13 != local_698);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,
             "\n  //=========================\n  //=== CONSTEXPR CALLEEs ===\n  //=========================\n"
            );
  p_Var13 = (local_690->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  local_698 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&(local_690->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header;
  if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)p_Var13 != local_698) {
    p_Var2 = (_Base_ptr)(local_640 + 0x10);
    do {
      if ((char)p_Var13[2]._M_color == _S_black) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_640,(char (*) [7])"reason",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &p_Var13[3]._M_left);
        __l_01._M_len = 1;
        __l_01._M_array =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_640;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_c0,__l_01,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_440,(allocator_type *)&local_6d8);
        replaceWithMap(&local_500.first,&local_3c0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_c0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_c0);
        if ((_Base_ptr)local_640._32_8_ != (_Base_ptr)(local_640 + 0x30)) {
          operator_delete((void *)local_640._32_8_,local_640._48_8_ + 1);
        }
        if ((_Base_ptr)local_640._0_8_ != p_Var2) {
          operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
        }
      }
      else {
        local_500.first._M_dataplus._M_p = (pointer)&local_500.first.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"");
      }
      toCamelCase(&local_6d8.first,(string *)(p_Var13 + 1),false);
      local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"Vk","");
      local_640._0_8_ = p_Var2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_640,local_6d8.first._M_dataplus._M_p,
                 local_6d8.first._M_dataplus._M_p + (long)(string *)local_6d8.first._M_string_length
                );
      sVar10 = local_6f8._M_string_length;
      if ((local_6f8._M_string_length <= (ulong)local_640._8_8_) &&
         (((char *)local_6f8._M_string_length == (char *)0x0 ||
          (iVar12 = bcmp((void *)local_640._0_8_,local_6f8._M_dataplus._M_p,
                         local_6f8._M_string_length), iVar12 == 0)))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_640,0,
                   sVar10);
      }
      anon_unknown.dwarf_18c225::startLowerCase(&local_440.first,(string *)local_640);
      if ((_Base_ptr)local_640._0_8_ != p_Var2) {
        operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8.first._M_dataplus._M_p != &local_6d8.first.field_2) {
        operator_delete(local_6d8.first._M_dataplus._M_p,
                        CONCAT71(local_6d8.first.field_2._M_allocated_capacity._1_7_,
                                 local_6d8.first.field_2._M_local_buf[0]) + 1);
      }
      local_6d8.first._M_dataplus._M_p = (pointer)&local_6d8.first.field_2;
      local_6d8.first._M_string_length = 0;
      local_6d8.first.field_2._M_local_buf[0] = '\0';
      __rhs = p_Var13[5]._M_left;
      p_Var5 = p_Var13[5]._M_right;
      if (__rhs == p_Var5) {
        puVar19 = (undefined1 *)0xfffffffffffffffe;
      }
      else {
        do {
          std::operator+(&local_6f8,"T const ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
          ;
          pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_6f8,", ");
          local_640._0_8_ = (pbVar14->_M_dataplus)._M_p;
          paVar18 = &pbVar14->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_640._0_8_ == paVar18) {
            local_640._16_8_ = paVar18->_M_allocated_capacity;
            local_640._24_8_ = *(long *)((long)&pbVar14->field_2 + 8);
            local_640._0_8_ = p_Var2;
          }
          else {
            local_640._16_8_ = paVar18->_M_allocated_capacity;
          }
          local_640._8_8_ = pbVar14->_M_string_length;
          (pbVar14->_M_dataplus)._M_p = (pointer)paVar18;
          pbVar14->_M_string_length = 0;
          (pbVar14->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_6d8.first,(char *)local_640._0_8_,local_640._8_8_);
          if ((_Base_ptr)local_640._0_8_ != p_Var2) {
            operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
            operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
          }
          __rhs = __rhs + 1;
        } while (__rhs != p_Var5);
        puVar19 = (undefined1 *)
                  ((long)&(((VulkanHppGenerator *)(local_6d8.first._M_string_length + -0x570))->
                          m_vulkanLicenseHeader).field_2 + 0xe);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (&local_6d8.first,(size_type)puVar19,'\0');
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_640,(char (*) [10])"arguments",&local_6d8.first);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[10],_true>(&local_600,(char (*) [10])"constName",&local_440.first);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_true>(&local_5c0,(char (*) [11])"deprecated",&local_500.first);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[15],_true>
                (&local_580,(char (*) [15])"implementation",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &p_Var13[6]._M_parent);
      __l_02._M_len = 4;
      __l_02._M_array = (iterator)local_640;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_f0,__l_02,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_660,(allocator_type *)&local_360);
      replaceWithMap(&local_6f8,&local_300,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_f0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_f0);
      lVar22 = -0x100;
      paVar18 = &local_580.second.field_2;
      do {
        if (paVar18 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar18->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                          paVar18->_M_allocated_capacity + 1);
        }
        if (&paVar18->_M_allocated_capacity + -4 !=
            (size_type *)(&paVar18->_M_allocated_capacity)[-6]) {
          operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                          (&paVar18->_M_allocated_capacity)[-4] + 1);
        }
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar18->_M_allocated_capacity + -8);
        lVar22 = lVar22 + 0x40;
      } while (lVar22 != 0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_6f8._M_dataplus._M_p,local_6f8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8.first._M_dataplus._M_p != &local_6d8.first.field_2) {
        operator_delete(local_6d8.first._M_dataplus._M_p,
                        CONCAT71(local_6d8.first.field_2._M_allocated_capacity._1_7_,
                                 local_6d8.first.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440.first._M_dataplus._M_p != &local_440.first.field_2) {
        operator_delete(local_440.first._M_dataplus._M_p,
                        local_440.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500.first._M_dataplus._M_p != &local_500.first.field_2) {
        operator_delete(local_500.first._M_dataplus._M_p,
                        CONCAT71(local_500.first.field_2._M_allocated_capacity._1_7_,
                                 local_500.first.field_2._M_local_buf[0]) + 1);
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)p_Var13 != local_698);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,
             "\n  //=========================\n  //=== CONSTEXPR CALLERs ===\n  //=========================\n"
            );
  ppVar15 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_690->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left;
  local_698 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&(local_690->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header;
  if (ppVar15 != local_698) {
    p_Var13 = (_Base_ptr)(local_640 + 0x10);
    do {
      if (*(char *)&ppVar15[1].first._M_dataplus._M_p == '\x01') {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_640,(char (*) [7])"reason",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ppVar15[1].second.field_2);
        __l_03._M_len = 1;
        __l_03._M_array =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_640;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1b0,__l_03,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_440,(allocator_type *)&local_6d8);
        replaceWithMap(&local_500.first,&local_3c0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_1b0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_1b0);
        if ((_Base_ptr)local_640._32_8_ != (_Base_ptr)(local_640 + 0x30)) {
          operator_delete((void *)local_640._32_8_,local_640._48_8_ + 1);
        }
        if ((_Base_ptr)local_640._0_8_ != p_Var13) {
          operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
        }
      }
      else {
        local_500.first._M_dataplus._M_p = (pointer)&local_500.first.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"");
      }
      toCamelCase((string *)local_640,&ppVar15->second,false);
      local_6d8.first._M_dataplus._M_p = (pointer)&local_6d8.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"Vk","");
      local_440.first._M_dataplus._M_p = (pointer)&local_440.first.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_440,local_640._0_8_,(char *)(local_640._8_8_ + local_640._0_8_));
      sVar10 = local_6d8.first._M_string_length;
      _Var17._M_p = local_6d8.first._M_dataplus._M_p;
      if ((local_6d8.first._M_string_length <= local_440.first._M_string_length) &&
         (((VulkanHppGenerator *)local_6d8.first._M_string_length == (VulkanHppGenerator *)0x0 ||
          (iVar12 = bcmp(local_440.first._M_dataplus._M_p,local_6d8.first._M_dataplus._M_p,
                         local_6d8.first._M_string_length), iVar12 == 0)))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&local_440.first,0,sVar10);
        _Var17._M_p = local_6d8.first._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var17._M_p != &local_6d8.first.field_2) {
        operator_delete(_Var17._M_p,
                        CONCAT71(local_6d8.first.field_2._M_allocated_capacity._1_7_,
                                 local_6d8.first.field_2._M_local_buf[0]) + 1);
      }
      if ((_Base_ptr)local_640._0_8_ != p_Var13) {
        operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
      }
      local_6d8.first._M_dataplus._M_p = (pointer)&local_6d8.first.field_2;
      local_6d8.first._M_string_length = 0;
      local_6d8.first.field_2._M_local_buf[0] = '\0';
      plVar21 = (long *)ppVar15[2].second.field_2._M_allocated_capacity;
      plVar6 = *(long **)((long)&ppVar15[2].second.field_2 + 8);
      if (plVar21 == plVar6) {
        puVar19 = (undefined1 *)0xfffffffffffffffe;
      }
      else {
        do {
          local_640._0_8_ = p_Var13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_640,*plVar21,plVar21[1] + *plVar21);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_640,
                     ", ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_6d8.first,(char *)local_640._0_8_,local_640._8_8_);
          if ((_Base_ptr)local_640._0_8_ != p_Var13) {
            operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
          }
          plVar21 = plVar21 + 4;
        } while (plVar21 != plVar6);
        puVar19 = (undefined1 *)
                  ((long)&(((VulkanHppGenerator *)(local_6d8.first._M_string_length + -0x570))->
                          m_vulkanLicenseHeader).field_2 + 0xe);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (&local_6d8.first,(size_type)puVar19,'\0');
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_640,(char (*) [10])"arguments",&local_6d8.first);
      anon_unknown.dwarf_18c225::startLowerCase(&local_660,(string *)&ppVar15[2].first.field_2);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_600,(char (*) [7])"callee",&local_660);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[10],_true>(&local_5c0,(char (*) [10])"constName",&local_440.first);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_true>(&local_580,(char (*) [11])"deprecated",&local_500.first);
      __l_04._M_len = 4;
      __l_04._M_array =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_640;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_120,__l_04,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_360,(allocator_type *)&local_2e0);
      replaceWithMap(&local_6f8,&local_320,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_120);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_120);
      lVar22 = -0x100;
      paVar18 = &local_580.second.field_2;
      do {
        if (paVar18 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar18->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                          paVar18->_M_allocated_capacity + 1);
        }
        if (&paVar18->_M_allocated_capacity + -4 !=
            (size_type *)(&paVar18->_M_allocated_capacity)[-6]) {
          operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                          (&paVar18->_M_allocated_capacity)[-4] + 1);
        }
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar18->_M_allocated_capacity + -8);
        lVar22 = lVar22 + 0x40;
      } while (lVar22 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_660._M_dataplus._M_p != &local_660.field_2) {
        operator_delete(local_660._M_dataplus._M_p,
                        CONCAT71(local_660.field_2._M_allocated_capacity._1_7_,
                                 local_660.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_6f8._M_dataplus._M_p,local_6f8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
        operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8.first._M_dataplus._M_p != &local_6d8.first.field_2) {
        operator_delete(local_6d8.first._M_dataplus._M_p,
                        CONCAT71(local_6d8.first.field_2._M_allocated_capacity._1_7_,
                                 local_6d8.first.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440.first._M_dataplus._M_p != &local_440.first.field_2) {
        operator_delete(local_440.first._M_dataplus._M_p,
                        local_440.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500.first._M_dataplus._M_p != &local_500.first.field_2) {
        operator_delete(local_500.first._M_dataplus._M_p,
                        CONCAT71(local_500.first.field_2._M_allocated_capacity._1_7_,
                                 local_500.first.field_2._M_local_buf[0]) + 1);
      }
      ppVar15 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)std::_Rb_tree_increment((_Rb_tree_node_base *)ppVar15);
    } while (ppVar15 != local_698);
  }
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f8,
             "\n  //=================================\n  //=== CONSTEXPR EXTENSION NAMEs ===\n  //=================================\n\n  ${extensionConstexprs}\n"
             ,"");
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  local_660._M_string_length = 0;
  local_660.field_2._M_local_buf[0] = '\0';
  uVar16 = extraout_RDX;
  if ((generateConstexprDefines[abi:cxx11]()::extensionTemplate_abi_cxx11_ == '\0') &&
     (iVar12 = __cxa_guard_acquire(&generateConstexprDefines[abi:cxx11]()::
                                    extensionTemplate_abi_cxx11_), uVar16 = extraout_RDX_10,
     iVar12 != 0)) {
    generateConstexprDefines[abi:cxx11]()::extensionTemplate_abi_cxx11_._M_dataplus._M_p =
         (pointer)&generateConstexprDefines[abi:cxx11]()::extensionTemplate_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&generateConstexprDefines[abi:cxx11]()::extensionTemplate_abi_cxx11_,
               "${deprecated}VULKAN_HPP_CONSTEXPR_INLINE auto ${var} = ${macro};\n","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &generateConstexprDefines[abi:cxx11]()::extensionTemplate_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&generateConstexprDefines[abi:cxx11]()::extensionTemplate_abi_cxx11_);
    uVar16 = extraout_RDX_11;
  }
  if ((generateConstexprDefines[abi:cxx11]()::deprecatedPrefixTemplate_abi_cxx11_ == '\0') &&
     (iVar12 = __cxa_guard_acquire(&generateConstexprDefines[abi:cxx11]()::
                                    deprecatedPrefixTemplate_abi_cxx11_), uVar16 = extraout_RDX_12,
     iVar12 != 0)) {
    generateConstexprDefines[abi:cxx11]()::deprecatedPrefixTemplate_abi_cxx11_._M_dataplus._M_p =
         (pointer)&generateConstexprDefines[abi:cxx11]()::deprecatedPrefixTemplate_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&generateConstexprDefines[abi:cxx11]()::deprecatedPrefixTemplate_abi_cxx11_
               ,"VULKAN_HPP_DEPRECATED( ${message} ) ","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &generateConstexprDefines[abi:cxx11]()::deprecatedPrefixTemplate_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&generateConstexprDefines[abi:cxx11]()::deprecatedPrefixTemplate_abi_cxx11_)
    ;
    uVar16 = extraout_RDX_13;
  }
  if ((generateConstexprDefines[abi:cxx11]()::deprecatedByMessageTemplate_abi_cxx11_ == '\0') &&
     (iVar12 = __cxa_guard_acquire(&generateConstexprDefines[abi:cxx11]()::
                                    deprecatedByMessageTemplate_abi_cxx11_),
     uVar16 = extraout_RDX_14, iVar12 != 0)) {
    generateConstexprDefines[abi:cxx11]()::deprecatedByMessageTemplate_abi_cxx11_._M_dataplus._M_p =
         (pointer)&generateConstexprDefines[abi:cxx11]()::deprecatedByMessageTemplate_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &generateConstexprDefines[abi:cxx11]()::deprecatedByMessageTemplate_abi_cxx11_,
               "\"The ${extensionName} extension has been deprecated by ${deprecatedBy}.\"","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &generateConstexprDefines[abi:cxx11]()::deprecatedByMessageTemplate_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&generateConstexprDefines[abi:cxx11]()::
                         deprecatedByMessageTemplate_abi_cxx11_);
    uVar16 = extraout_RDX_15;
  }
  if ((generateConstexprDefines[abi:cxx11]()::deprecatedMessageTemplate_abi_cxx11_ == '\0') &&
     (iVar12 = __cxa_guard_acquire(&generateConstexprDefines[abi:cxx11]()::
                                    deprecatedMessageTemplate_abi_cxx11_), uVar16 = extraout_RDX_16,
     iVar12 != 0)) {
    generateConstexprDefines[abi:cxx11]()::deprecatedMessageTemplate_abi_cxx11_._M_dataplus._M_p =
         (pointer)&generateConstexprDefines[abi:cxx11]()::deprecatedMessageTemplate_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &generateConstexprDefines[abi:cxx11]()::deprecatedMessageTemplate_abi_cxx11_,
               "\"The ${extensionName} extension has been deprecated.\"","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &generateConstexprDefines[abi:cxx11]()::deprecatedMessageTemplate_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&generateConstexprDefines[abi:cxx11]()::deprecatedMessageTemplate_abi_cxx11_
                       );
    uVar16 = extraout_RDX_17;
  }
  if ((generateConstexprDefines[abi:cxx11]()::obsoletedMessageTemplate_abi_cxx11_ == '\0') &&
     (iVar12 = __cxa_guard_acquire(&generateConstexprDefines[abi:cxx11]()::
                                    obsoletedMessageTemplate_abi_cxx11_), uVar16 = extraout_RDX_18,
     iVar12 != 0)) {
    generateConstexprDefines[abi:cxx11]()::obsoletedMessageTemplate_abi_cxx11_._M_dataplus._M_p =
         (pointer)&generateConstexprDefines[abi:cxx11]()::obsoletedMessageTemplate_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&generateConstexprDefines[abi:cxx11]()::obsoletedMessageTemplate_abi_cxx11_
               ,"\"The ${extensionName} extension has been obsoleted by ${obsoletedBy}.\"","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &generateConstexprDefines[abi:cxx11]()::obsoletedMessageTemplate_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&generateConstexprDefines[abi:cxx11]()::obsoletedMessageTemplate_abi_cxx11_)
    ;
    uVar16 = extraout_RDX_19;
  }
  pEVar20 = (local_690->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (local_690->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar20 != pEVar4) {
    local_698 = &local_5c0;
    local_2a8 = &local_480;
    local_2b8 = &local_480.second.field_2;
    local_2b0 = &local_5c0.second.field_2;
    do {
      pRVar7 = (pEVar20->requireData).
               super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pEVar20->requireData).
          super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          ._M_impl.super__Vector_impl_data._M_finish == pRVar7) {
        __assert_fail("requireDatas.size() >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x1408,"std::string VulkanHppGenerator::generateConstexprDefines() const");
      }
      if ((pRVar7->enumConstants)._M_t._M_impl.super__Rb_tree_header._M_node_count < 2) {
        __assert_fail("requireDatas.front().enumConstants.size() >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x1409,"std::string VulkanHppGenerator::generateConstexprDefines() const");
      }
      p_Var13 = (pRVar7->enumConstants)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      auVar23._8_8_ = uVar16;
      auVar23._0_8_ = p_Var13;
      p_Var1 = &(pRVar7->enumConstants)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var13 != p_Var1) {
        do {
          local_640._8_8_ = *(undefined8 *)(p_Var13 + 1);
          local_640._0_8_ = p_Var13[1]._M_parent;
          bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_640,
                              "_EXTENSION_NAME");
          auVar23._8_8_ = extraout_RDX_00;
          auVar23._0_8_ = p_Var13;
          if (bVar11) break;
          auVar23 = std::_Rb_tree_increment(p_Var13);
          p_Var13 = auVar23._0_8_;
        } while ((_Rb_tree_header *)p_Var13 != p_Var1);
        p_Var13 = (pRVar7->enumConstants)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      auVar24._8_8_ = auVar23._8_8_;
      auVar24._0_8_ = p_Var13;
      while( true ) {
        macro = auVar24._8_8_;
        p_Var9 = auVar24._0_8_;
        if ((_Rb_tree_header *)p_Var9 == p_Var1) break;
        local_640._8_8_ = *(undefined8 *)(p_Var9 + 1);
        local_640._0_8_ = p_Var9[1]._M_parent;
        bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_640,
                            "_SPEC_VERSION");
        macro = extraout_RDX_01;
        if (bVar11) break;
        auVar24 = std::_Rb_tree_increment(p_Var9);
      }
      if ((_Rb_tree_header *)auVar23._0_8_ == p_Var1) {
        __assert_fail("extensionMacroPtr != enumConstants.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x1416,"std::string VulkanHppGenerator::generateConstexprDefines() const");
      }
      if ((_Rb_tree_header *)p_Var9 == p_Var1) {
        __assert_fail("specVersionMacroPtr != enumConstants.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x1417,"std::string VulkanHppGenerator::generateConstexprDefines() const");
      }
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (auVar23._0_8_ + 0x20);
      generateConstexprDefines::anon_class_1_0_00000001::operator()
                (&local_360,(anon_class_1_0_00000001 *)pbVar14,macro);
      generateConstexprDefines::anon_class_1_0_00000001::operator()
                (&local_2e0,(anon_class_1_0_00000001 *)(p_Var9 + 1),macro_00);
      local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
      local_520._M_string_length = 0;
      local_520.field_2._M_local_buf[0] = '\0';
      if (pEVar20->isDeprecated == true) {
        if (((pEVar20->obsoletedBy)._M_string_length != 0) ||
           ((pEVar20->promotedTo)._M_string_length != 0)) {
          __assert_fail("extension.obsoletedBy.empty() && extension.promotedTo.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x1422,"std::string VulkanHppGenerator::generateConstexprDefines() const");
        }
        local_2c0 = (pEVar20->deprecatedBy)._M_string_length;
        if (local_2c0 == 0) {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[14],_true>(&local_6d8,(char (*) [14])"extensionName",&pEVar20->name)
          ;
          __l_08._M_len = 1;
          __l_08._M_array = &local_6d8;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_1e0,__l_08,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_500,&local_681);
          replaceWithMap((string *)local_640,
                         &generateConstexprDefines[abi:cxx11]()::
                          deprecatedMessageTemplate_abi_cxx11_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1e0);
        }
        else {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[14],_true>(&local_440,(char (*) [14])"extensionName",&pEVar20->name)
          ;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[13],_true>
                    (&local_400,(char (*) [13])"deprecatedBy",&pEVar20->deprecatedBy);
          __l_10._M_len = 2;
          __l_10._M_array = &local_440;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_210,__l_10,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_540,&local_682);
          replaceWithMap((string *)local_640,
                         &generateConstexprDefines[abi:cxx11]()::
                          deprecatedByMessageTemplate_abi_cxx11_,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_210);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_520,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_640);
        if ((_Base_ptr)local_640._0_8_ != (_Base_ptr)(local_640 + 0x10)) {
          operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
        }
        if (local_2c0 == 0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_1e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d8.second._M_dataplus._M_p != &local_6d8.second.field_2) {
            operator_delete(local_6d8.second._M_dataplus._M_p,
                            local_6d8.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d8.first._M_dataplus._M_p != &local_6d8.first.field_2) {
            operator_delete(local_6d8.first._M_dataplus._M_p,
                            CONCAT71(local_6d8.first.field_2._M_allocated_capacity._1_7_,
                                     local_6d8.first.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_210);
          lVar22 = -0x80;
          paVar18 = &local_400.second.field_2;
          do {
            if (paVar18 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar18->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                              paVar18->_M_allocated_capacity + 1);
            }
            if (&paVar18->_M_allocated_capacity + -4 !=
                (size_type *)(&paVar18->_M_allocated_capacity)[-6]) {
              operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                              (&paVar18->_M_allocated_capacity)[-4] + 1);
            }
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar18->_M_allocated_capacity + -8);
            lVar22 = lVar22 + 0x40;
          } while (lVar22 != 0);
        }
      }
      else if ((pEVar20->obsoletedBy)._M_string_length != 0) {
        if ((pEVar20->promotedTo)._M_string_length != 0) {
          __assert_fail("extension.promotedTo.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                        ,0x1429,"std::string VulkanHppGenerator::generateConstexprDefines() const");
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[14],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_640,(char (*) [14])"extensionName",&pEVar20->name);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[12],_true>
                  (&local_600,(char (*) [12])"obsoletedBy",&pEVar20->obsoletedBy);
        __l_09._M_len = 2;
        __l_09._M_array =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_640;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_240,__l_09,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_540,(allocator_type *)&local_680);
        replaceWithMap(&local_500.first,
                       &generateConstexprDefines[abi:cxx11]()::obsoletedMessageTemplate_abi_cxx11_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_240);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_520,&local_500.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_500.first._M_dataplus._M_p != &local_500.first.field_2) {
          operator_delete(local_500.first._M_dataplus._M_p,
                          CONCAT71(local_500.first.field_2._M_allocated_capacity._1_7_,
                                   local_500.first.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_240);
        lVar22 = -0x80;
        paVar18 = &local_600.second.field_2;
        do {
          if (paVar18 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar18->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                            paVar18->_M_allocated_capacity + 1);
          }
          if (&paVar18->_M_allocated_capacity + -4 !=
              (size_type *)(&paVar18->_M_allocated_capacity)[-6]) {
            operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                            (&paVar18->_M_allocated_capacity)[-4] + 1);
          }
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar18->_M_allocated_capacity + -8);
          lVar22 = lVar22 + 0x40;
        } while (lVar22 != 0);
      }
      if (local_520._M_string_length == 0) {
        local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"");
      }
      else {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_640,(char (*) [8])"message",&local_520);
        __l_05._M_len = 1;
        __l_05._M_array =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_640;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_150,__l_05,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_500,(allocator_type *)&local_680);
        replaceWithMap(&local_540,
                       &generateConstexprDefines[abi:cxx11]()::deprecatedPrefixTemplate_abi_cxx11_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_150);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_150);
        if ((_Base_ptr)local_640._32_8_ != (_Base_ptr)(local_640 + 0x30)) {
          operator_delete((void *)local_640._32_8_,local_640._48_8_ + 1);
        }
        if ((_Base_ptr)local_640._0_8_ != (_Base_ptr)(local_640 + 0x10)) {
          operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
        }
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_640,(char (*) [11])"deprecated",&local_540);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[6],_true>(&local_600,(char (*) [6])"macro",pbVar14);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_true>(local_698,(char (*) [4])"var",&local_360);
      __l_06._M_len = 3;
      __l_06._M_array =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_640;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_180,__l_06,&local_683,&local_684);
      replaceWithMap(&local_380,&generateConstexprDefines[abi:cxx11]()::extensionTemplate_abi_cxx11_
                     ,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_180);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_true>(&local_500,(char (*) [11])"deprecated",&local_540);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[6],_true>
                (&local_4c0,(char (*) [6])"macro",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1));
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_true>(local_2a8,(char (*) [4])"var",&local_2e0);
      __l_07._M_len = 3;
      __l_07._M_array = &local_500;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_270,__l_07,&local_685,&local_686);
      replaceWithMap(&local_3a0,&generateConstexprDefines[abi:cxx11]()::extensionTemplate_abi_cxx11_
                     ,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_270);
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        uVar16 = local_380.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_3a0._M_string_length + local_380._M_string_length) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          uVar16 = local_3a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_3a0._M_string_length + local_380._M_string_length)
        goto LAB_00120a49;
        pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace(&local_3a0,0,0,local_380._M_dataplus._M_p,local_380._M_string_length);
      }
      else {
LAB_00120a49:
        pbVar14 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_380,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
      }
      local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar14->_M_dataplus)._M_p;
      paVar18 = &pbVar14->field_2;
      if (paVar8 == paVar18) {
        local_680.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_680.field_2._8_8_ = *(undefined8 *)((long)&pbVar14->field_2 + 8);
      }
      else {
        local_680.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
        local_680._M_dataplus._M_p = (pointer)paVar8;
      }
      local_680._M_string_length = pbVar14->_M_string_length;
      (pbVar14->_M_dataplus)._M_p = (pointer)paVar18;
      pbVar14->_M_string_length = 0;
      paVar18->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_270);
      lVar22 = -0xc0;
      paVar18 = local_2b8;
      do {
        if (paVar18 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar18->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                          paVar18->_M_allocated_capacity + 1);
        }
        if (&paVar18->_M_allocated_capacity + -4 !=
            (size_type *)(&paVar18->_M_allocated_capacity)[-6]) {
          operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                          (&paVar18->_M_allocated_capacity)[-4] + 1);
        }
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar18->_M_allocated_capacity + -8);
        lVar22 = lVar22 + 0x40;
      } while (lVar22 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != &local_380.field_2) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_180);
      lVar22 = -0xc0;
      paVar18 = local_2b0;
      do {
        if (paVar18 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar18->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar18->_M_allocated_capacity)[-2],
                          paVar18->_M_allocated_capacity + 1);
        }
        if (&paVar18->_M_allocated_capacity + -4 !=
            (size_type *)(&paVar18->_M_allocated_capacity)[-6]) {
          operator_delete((size_type *)(&paVar18->_M_allocated_capacity)[-6],
                          (&paVar18->_M_allocated_capacity)[-4] + 1);
        }
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar18->_M_allocated_capacity + -8);
        lVar22 = lVar22 + 0x40;
      } while (lVar22 != 0);
      local_500.first._M_dataplus._M_p = (pointer)&local_500.first.field_2;
      local_500.first._M_string_length = 0;
      local_500.first.field_2._M_local_buf[0] = '\0';
      addTitleAndProtection
                ((string *)local_640,local_690,&pEVar20->name,&local_680,&local_500.first);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_660,(char *)local_640._0_8_,local_640._8_8_);
      uVar16 = extraout_RDX_02;
      if ((_Base_ptr)local_640._0_8_ != (_Base_ptr)(local_640 + 0x10)) {
        operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
        uVar16 = extraout_RDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500.first._M_dataplus._M_p != &local_500.first.field_2) {
        operator_delete(local_500.first._M_dataplus._M_p,
                        CONCAT71(local_500.first.field_2._M_allocated_capacity._1_7_,
                                 local_500.first.field_2._M_local_buf[0]) + 1);
        uVar16 = extraout_RDX_04;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_680._M_dataplus._M_p != &local_680.field_2) {
        operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
        uVar16 = extraout_RDX_05;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540._M_dataplus._M_p != &local_540.field_2) {
        operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
        uVar16 = extraout_RDX_06;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,
                        CONCAT71(local_520.field_2._M_allocated_capacity._1_7_,
                                 local_520.field_2._M_local_buf[0]) + 1);
        uVar16 = extraout_RDX_07;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        uVar16 = extraout_RDX_08;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        uVar16 = extraout_RDX_09;
      }
      pEVar20 = pEVar20 + 1;
    } while (pEVar20 != pEVar4);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_640,(char (*) [20])"extensionConstexprs",&local_660);
  __l_11._M_len = 1;
  __l_11._M_array = (iterator)local_640;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_2a0,__l_11,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_360,(allocator_type *)&local_2e0);
  replaceWithMap(&local_500.first,&local_6f8,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_2a0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_500.first._M_dataplus._M_p,
             local_500.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500.first._M_dataplus._M_p != &local_500.first.field_2) {
    operator_delete(local_500.first._M_dataplus._M_p,
                    CONCAT71(local_500.first.field_2._M_allocated_capacity._1_7_,
                             local_500.first.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2a0);
  if ((_Base_ptr)local_640._32_8_ != (_Base_ptr)(local_640 + 0x30)) {
    operator_delete((void *)local_640._32_8_,local_640._48_8_ + 1);
  }
  if ((_Base_ptr)local_640._0_8_ != (_Base_ptr)(local_640 + 0x10)) {
    operator_delete((void *)local_640._0_8_,(ulong)(local_640._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,
                    CONCAT71(local_660.field_2._M_allocated_capacity._1_7_,
                             local_660.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateConstexprDefines() const
{
  auto const constexprFunctionTemplate = std::string{ R"(  template <typename T, typename = typename std::enable_if<std::is_integral<T>::value>::type>
  ${deprecated}VULKAN_HPP_CONSTEXPR uint32_t ${constName}( ${arguments} )
  {
    return ${implementation};
  }
)" };
  auto const constexprCallTemplate     = std::string{ R"(  ${deprecated}VULKAN_HPP_CONSTEXPR_INLINE auto ${constName} = ${callee}( ${arguments} );
)" };
  auto const constexprValueTemplate    = std::string{ R"(  ${deprecated}VULKAN_HPP_CONSTEXPR_INLINE ${type} ${constName} = ${value};
)" };
  auto const deprecatedAttribute       = std::string{ R"(VULKAN_HPP_DEPRECATED("${reason}") )" };

  // handle the value and callee macros first so they are visible for use in functions below.

  auto constexprDefines = std::string{ R"(
  //===========================
  //=== CONSTEXPR CONSTANTs ===
  //===========================
)" };

  {
    auto const generateConstantsAndProtection =
      [&constexprValueTemplate, this]( std::vector<RequireData> const & requireData, std::string const & title, std::set<std::string> & listedConstants )
    {
      auto constants = std::string{};
      for ( auto const & require : requireData )
      {
        for ( auto const & constant : require.constants )
        {
          if ( !listedConstants.contains( constant ) )
          {
            auto        constIt = m_constants.find( constant );
            std::string tag     = findTag( constant );
            constants += replaceWithMap( constexprValueTemplate,
                                         { { "type", constIt->second.type },
                                           { "constName", stripPrefix( toCamelCase( stripPostfix( constant, tag ) ), "Vk" ) + tag },
                                           { "deprecated", "" },
                                           { "value", constant } } );
            listedConstants.insert( constant );
          }
        }
      }
      return addTitleAndProtection( title, constants );
    };

    std::set<std::string> listedConstants;
    for ( auto const & feature : m_features )
    {
      constexprDefines += generateConstantsAndProtection( feature.requireData, feature.name, listedConstants );
    }
    for ( auto const & extension : m_extensions )
    {
      constexprDefines += generateConstantsAndProtection( extension.requireData, extension.name, listedConstants );
    }
  }

  // values
  constexprDefines += R"(
  //========================
  //=== CONSTEXPR VALUEs ===
  //========================
)";
  for ( auto const & [macro, data] : m_definesPartition.values )
  {
    auto const deprecated = data.deprecated ? replaceWithMap( deprecatedAttribute, { { "reason", data.deprecationReason } } ) : "";

    // make `macro` PascalCase and strip the `Vk` prefix
    auto const constName = stripPrefix( toCamelCase( macro ), "Vk" );
    auto const valueString =
      replaceWithMap( constexprValueTemplate, { { "type", "uint32_t" }, { "constName", constName }, { "deprecated", deprecated }, { "value", macro } } );

    constexprDefines += valueString;
  }

  // functions
  constexprDefines += R"(
  //=========================
  //=== CONSTEXPR CALLEEs ===
  //=========================
)";
  for ( auto const & [macro, data] : m_definesPartition.callees )
  {
    auto const deprecated = data.deprecated ? replaceWithMap( deprecatedAttribute, { { "reason", data.deprecationReason } } ) : "";
    // make `macro` camelCase and strip the `Vk` prefix
    auto const constName = startLowerCase( stripPrefix( toCamelCase( macro ), "Vk" ) );
    // for every parameter, need to use auto const and append a comma if needed (i.e. has more than one parameter, and not for the last one)
    auto parametersString = std::string{};
    for ( auto const & paramString : data.params )
    {
      parametersString += "T const " + paramString + ", ";
    }
    // trim the last two characters (i.e. the last comma and the space)
    parametersString.resize( parametersString.size() - 2 );

    auto const functionString = replaceWithMap(
      constexprFunctionTemplate,
      { { "arguments", parametersString }, { "constName", constName }, { "deprecated", deprecated }, { "implementation", data.possibleDefinition } } );

    constexprDefines += functionString;
  }

  // callers
  constexprDefines += R"(
  //=========================
  //=== CONSTEXPR CALLERs ===
  //=========================
)";
  for ( auto const & [macro, data] : m_definesPartition.callers )
  {
    auto const deprecated = data.deprecated ? replaceWithMap( deprecatedAttribute, { { "reason", data.deprecationReason } } ) : "";
    // make `macro` PascalCase and strip the `Vk` prefix
    auto const constName       = stripPrefix( toCamelCase( macro ), "Vk" );
    auto       argumentsString = std::string{};

    // for every argument, append a comma if needed (i.e. has more than one parameter, and not for the last one)
    for ( auto const & argString : data.params )
    {
      argumentsString += argString + ", ";
    }
    // trim the last two characters (i.e. the last comma and the space)
    argumentsString.resize( argumentsString.size() - 2 );

    auto const callerString = replaceWithMap(
      constexprCallTemplate,
      { { "arguments", argumentsString }, { "callee", startLowerCase( data.possibleCallee ) }, { "constName", constName }, { "deprecated", deprecated } } );
    constexprDefines += callerString;
  }

  // extension constexprs
  auto const extensionConstexprDefinesTemplate = std::string{ R"(
  //=================================
  //=== CONSTEXPR EXTENSION NAMEs ===
  //=================================

  ${extensionConstexprs}
)" };

  auto extensionConstexprs = std::string{};

  static auto const extensionTemplate           = std::string{ R"(${deprecated}VULKAN_HPP_CONSTEXPR_INLINE auto ${var} = ${macro};
)" };
  static auto const deprecatedPrefixTemplate    = std::string{ R"(VULKAN_HPP_DEPRECATED( ${message} ) )" };
  static auto const deprecatedByMessageTemplate = std::string{ R"("The ${extensionName} extension has been deprecated by ${deprecatedBy}.")" };
  static auto const deprecatedMessageTemplate   = std::string{ R"("The ${extensionName} extension has been deprecated.")" };
  static auto const obsoletedMessageTemplate    = std::string{ R"("The ${extensionName} extension has been obsoleted by ${obsoletedBy}.")" };

  // I really, really wish C++ had discards for structured bindings...
  for ( auto const & extension : m_extensions )
  {
    auto const & requireDatas = extension.requireData;

    // assert that requireDatas has at least one require...
    // and the first require has at least two enumConstants, which we are going to use
    assert( requireDatas.size() >= 1 );
    assert( requireDatas.front().enumConstants.size() >= 2 );
    auto const & enumConstants = requireDatas.front().enumConstants;

    auto const VENDORPascalCaseStripPrefix = []( std::string const & macro )
    {
      auto       prefixStripped = stripPrefix( macro, "VK_" );
      auto const vendor         = prefixStripped.substr( 0, prefixStripped.find( '_' ) );
      return vendor + toCamelCase( stripPrefix( prefixStripped, vendor + "_" ) );
    };

    // add asserts so we don't get a nullptr exception below
    auto const & extensionMacroPtr   = std::ranges::find_if( enumConstants, []( auto const & keyval ) { return keyval.first.ends_with( "_EXTENSION_NAME" ); } );
    auto const & specVersionMacroPtr = std::ranges::find_if( enumConstants, []( auto const & keyval ) { return keyval.first.ends_with( "_SPEC_VERSION" ); } );
    assert( extensionMacroPtr != enumConstants.end() );
    assert( specVersionMacroPtr != enumConstants.end() );

    auto const & extensionMacro   = extensionMacroPtr->first;
    auto const & specVersionMacro = specVersionMacroPtr->first;

    auto const extensionVar   = VENDORPascalCaseStripPrefix( extensionMacro );
    auto const specVersionVar = VENDORPascalCaseStripPrefix( specVersionMacro );

    std::string deprecationMessage;
    if ( extension.isDeprecated )
    {
      assert( extension.obsoletedBy.empty() && extension.promotedTo.empty() );
      deprecationMessage = extension.deprecatedBy.empty()
                           ? replaceWithMap( deprecatedMessageTemplate, { { "extensionName", extension.name } } )
                           : replaceWithMap( deprecatedByMessageTemplate, { { "extensionName", extension.name }, { "deprecatedBy", extension.deprecatedBy } } );
    }
    else if ( !extension.obsoletedBy.empty() )
    {
      assert( extension.promotedTo.empty() );
      deprecationMessage = replaceWithMap( obsoletedMessageTemplate, { { "extensionName", extension.name }, { "obsoletedBy", extension.obsoletedBy } } );
    }
    else if ( !extension.promotedTo.empty() )
    {
      // promoted extensions are _not_ deprecated!
    }
    auto const deprecatedPrefix = deprecationMessage.empty() ? "" : replaceWithMap( deprecatedPrefixTemplate, { { "message", deprecationMessage } } );

    auto const thisExtensionConstexprs =
      replaceWithMap( extensionTemplate, { { "deprecated", deprecatedPrefix }, { "macro", extensionMacro }, { "var", extensionVar } } ) +
      replaceWithMap( extensionTemplate, { { "deprecated", deprecatedPrefix }, { "macro", specVersionMacro }, { "var", specVersionVar } } );

    extensionConstexprs += addTitleAndProtection( extension.name, thisExtensionConstexprs );
  }

  constexprDefines += replaceWithMap( extensionConstexprDefinesTemplate, { { "extensionConstexprs", extensionConstexprs } } );

  return constexprDefines;
}